

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

int __thiscall pg::FPISolver::updateBlock(FPISolver *this,int i,int n)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  _label_vertex _Var5;
  _label_vertex local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  int winner_to_1;
  int to_1;
  int *curedge_1;
  undefined1 local_58 [24];
  int winner_to;
  int to;
  int *curedge;
  undefined1 local_30 [4];
  int onestep_winner;
  int local_1c;
  int local_18;
  int res;
  int n_local;
  int i_local;
  FPISolver *this_local;
  
  local_1c = 0;
  local_18 = n;
  res = i;
  _n_local = this;
  do {
    if (local_18 == 0) {
      return local_1c;
    }
    bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)res);
    if ((!bVar1) && (this->frozen[res] == 0)) {
      bitset::operator[]((bitset *)local_30,(size_t)&this->distraction);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_30);
      if (!bVar1) {
        iVar3 = Solver::owner(&this->super_Solver,res);
        if (iVar3 == 0) {
          curedge._4_4_ = 1;
          for (_winner_to = Solver::outs(&this->super_Solver,res); *_winner_to != -1;
              _winner_to = _winner_to + 1) {
            local_58._20_4_ = *_winner_to;
            bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_58._20_4_);
            if (!bVar1) {
              bitset::operator[]((bitset *)local_58,(size_t)&this->parity);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_58);
              bitset::operator[]((bitset *)&curedge_1,(size_t)&this->distraction);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)&curedge_1);
              local_58._16_4_ = ZEXT14(bVar1 != bVar2);
              if (local_58._16_4_ == 0) {
                curedge._4_4_ = 0;
                this->strategy[res] = local_58._20_4_;
                break;
              }
            }
          }
        }
        else {
          curedge._4_4_ = 0;
          for (_winner_to_1 = Solver::outs(&this->super_Solver,res); *_winner_to_1 != -1;
              _winner_to_1 = _winner_to_1 + 1) {
            local_88._20_4_ = *_winner_to_1;
            bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_88._20_4_);
            if (!bVar1) {
              bitset::operator[]((bitset *)local_88,(size_t)&this->parity);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_88);
              bitset::operator[]((bitset *)local_98,(size_t)&this->distraction);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_98);
              local_88._16_4_ = ZEXT14(bVar1 != bVar2);
              if (local_88._16_4_ == 1) {
                curedge._4_4_ = 1;
                this->strategy[res] = local_88._20_4_;
                break;
              }
            }
          }
        }
        bitset::operator[]((bitset *)local_a8,(size_t)&this->parity);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_a8);
        if (bVar1 != curedge._4_4_) {
          bitset::operator[]((bitset *)local_b8,(size_t)&this->distraction);
          bitset::reference::operator=((reference *)local_b8,true);
          local_1c = local_1c + 1;
          if (1 < (this->super_Solver).trace) {
            poVar4 = std::operator<<((this->super_Solver).logger,"vertex ");
            _Var5 = Solver::label_vertex(&this->super_Solver,res);
            local_c8.g = _Var5.g;
            local_c8.v = _Var5.v;
            poVar4 = operator<<(poVar4,&local_c8);
            poVar4 = std::operator<<(poVar4," is now a distraction (won by ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,curedge._4_4_);
            poVar4 = std::operator<<(poVar4,")");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    res = res + 1;
    local_18 = local_18 + -1;
  } while( true );
}

Assistant:

int
FPISolver::updateBlock(int i, int n)
{
    int res = 0;
    for (; n != 0; i++, n--) {
        if (disabled[i]) continue;
        if (frozen[i]) continue;
        if (distraction[i]) continue;

        // update whether current vertex <i> is a distraction by computing the one step winner
        int onestep_winner;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    strategy[i] = to;
                    break;
                }
            }
        }
        if (parity[i] != onestep_winner) {
            distraction[i] = true;
            res++;
#ifndef NDEBUG
            if (trace >= 2) logger << "vertex " << label_vertex(i) << " is now a distraction (won by " << onestep_winner << ")" << std::endl;
#endif
        }
    }
    return res;
}